

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O1

string_t __thiscall
duckdb::HexStrOperator::Operation<duckdb::string_t,duckdb::string_t>
          (HexStrOperator *this,string_t input,Vector *result)

{
  anon_union_16_2_67f50693_for_value aVar1;
  ulong uVar2;
  ulong uVar3;
  undefined4 *puVar4;
  long lVar5;
  undefined1 auVar6 [16];
  string_t target;
  uint local_30;
  undefined4 uStack_2c;
  undefined4 *local_28;
  undefined8 local_20;
  long local_18;
  
  local_18 = input.value._0_8_;
  uVar3 = (ulong)this & 0xffffffff;
  lVar5 = local_18;
  if (uVar3 < 0xd) {
    lVar5 = (long)&local_20 + 4;
  }
  local_20 = this;
  auVar6 = duckdb::StringVector::EmptyString(input.value._8_8_,uVar3 * 2);
  local_28 = auVar6._8_8_;
  local_30 = auVar6._0_4_;
  uStack_2c = auVar6._4_4_;
  if (uVar3 != 0) {
    puVar4 = local_28;
    if (local_30 < 0xd) {
      puVar4 = &uStack_2c;
    }
    uVar2 = 0;
    do {
      *(char *)((long)puVar4 + uVar2 * 2) = "0123456789ABCDEF"[*(byte *)(lVar5 + uVar2) >> 4];
      *(char *)((long)puVar4 + uVar2 * 2 + 1) = "0123456789ABCDEF"[*(byte *)(lVar5 + uVar2) & 0xf];
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  uVar3 = auVar6._0_8_ & 0xffffffff;
  if (uVar3 < 0xd) {
    memset((void *)((long)&uStack_2c + uVar3),0,0xc - uVar3);
  }
  else {
    uStack_2c = *local_28;
  }
  aVar1._4_1_ = (undefined1)uStack_2c;
  aVar1._5_1_ = uStack_2c._1_1_;
  aVar1._6_1_ = uStack_2c._2_1_;
  aVar1._7_1_ = uStack_2c._3_1_;
  aVar1.pointer.length = local_30;
  aVar1.pointer.ptr = (char *)local_28;
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto data = input.GetData();
		auto size = input.GetSize();

		// Allocate empty space
		auto target = StringVector::EmptyString(result, size * 2);
		auto output = target.GetDataWriteable();

		for (idx_t i = 0; i < size; ++i) {
			*output = Blob::HEX_TABLE[(data[i] >> 4) & 0x0F];
			output++;
			*output = Blob::HEX_TABLE[data[i] & 0x0F];
			output++;
		}

		target.Finalize();
		return target;
	}